

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerSharedInputState.hpp
# Opt level: O0

void __thiscall antlr::LexerInputState::reset(LexerInputState *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 8) = 1;
  *(undefined4 *)(in_RDI + 0xc) = 1;
  *(undefined4 *)(in_RDI + 0x10) = 1;
  *(undefined4 *)(in_RDI + 0x14) = 1;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  (**(code **)(**(long **)(in_RDI + 0x40) + 0x10))();
  return;
}

Assistant:

virtual void reset( void )
	{
		column = 1;
		line = 1;
		tokenStartColumn = 1;
		tokenStartLine = 1;
		guessing = 0;
		input->reset();
	}